

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uciengine.cpp
# Opt level: O3

void __thiscall banksia::UciEngine::newGame(UciEngine *this)

{
  int iVar1;
  ssize_t sVar2;
  size_t __n;
  void *__buf;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  __n = (size_t)MoveFull::illegalMove.super_Move.promotion;
  (this->ponderingMove).promotion = MoveFull::illegalMove.super_Move.promotion;
  iVar1 = MoveFull::illegalMove.super_Move.dest;
  (this->ponderingMove).from = MoveFull::illegalMove.super_Move.from;
  (this->ponderingMove).dest = iVar1;
  this->expectingBestmove = false;
  (this->super_EngineProfile).super_Engine.computingState = idle;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"ucinewgame","");
  sVar2 = Engine::write((Engine *)this,(int)(string *)local_40,__buf,__n);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  if ((char)sVar2 != '\0') {
    Player::setState((Player *)this,playing);
  }
  return;
}

Assistant:

void UciEngine::newGame()
{
    assert(getState() == PlayerState::ready);
    ponderingMove = MoveFull::illegalMove;
    expectingBestmove = false;
    computingState = EngineComputingState::idle;
    if (write("ucinewgame")) {
        setState(PlayerState::playing);
    }
}